

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O2

float64 floatx80_to_float64_riscv32(floatx80 a,float_status *status)

{
  ulong uVar1;
  commonNaNT a_00;
  float64 fVar2;
  int zExp;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  floatx80 a_01;
  commonNaNT local_28;
  
  uVar3 = a._8_8_;
  uVar4 = a.low;
  a_01._8_8_ = uVar3 & 0xffffffff;
  if (((undefined1  [16])a & (undefined1  [16])0x7fff) != (undefined1  [16])0x0 && -1 < (long)uVar4)
  {
    status->float_exception_flags = status->float_exception_flags | 1;
    fVar2 = float64_default_nan_riscv32((float_status *)(uVar3 & 0xffff7fff));
    return fVar2;
  }
  uVar1 = (uVar3 & 0xffff) >> 0xf;
  if ((a.high & 0x7fff) == 0x7fff) {
    if (((undefined1  [16])a & (undefined1  [16])0x7fffffffffffffff) == (undefined1  [16])0x0) {
      fVar2 = uVar1 << 0x3f | 0x7ff0000000000000;
    }
    else {
      a_01.low = uVar4;
      floatx80ToCommonNaN(&local_28,a_01,status);
      a_00.high = local_28.high;
      a_00.sign = local_28.sign;
      a_00._1_7_ = local_28._1_7_;
      a_00.low = local_28.low;
      fVar2 = commonNaNToFloat64(a_00,status);
    }
    return fVar2;
  }
  iVar5 = (a._8_4_ & 0x7fff) - 0x3c01;
  zExp = 0;
  if ((short)(float_status *)(uVar3 & 0xffff7fff) != 0) {
    zExp = iVar5;
  }
  if (uVar4 != 0) {
    zExp = iVar5;
  }
  fVar2 = roundAndPackFloat64((flag)uVar1,zExp,(ulong)((uint)a.low & 1) | uVar4 >> 1,status);
  return fVar2;
}

Assistant:

float64 floatx80_to_float64(floatx80 a, float_status *status)
{
    flag aSign;
    int32_t aExp;
    uint64_t aSig, zSig;

    if (floatx80_invalid_encoding(a)) {
        float_raise(float_flag_invalid, status);
        return float64_default_nan(status);
    }
    aSig = extractFloatx80Frac( a );
    aExp = extractFloatx80Exp( a );
    aSign = extractFloatx80Sign( a );
    if ( aExp == 0x7FFF ) {
        if ( (uint64_t) ( aSig<<1 ) ) {
            return commonNaNToFloat64(floatx80ToCommonNaN(a, status), status);
        }
        return packFloat64( aSign, 0x7FF, 0 );
    }
    shift64RightJamming( aSig, 1, &zSig );
    if ( aExp || aSig ) aExp -= 0x3C01;
    return roundAndPackFloat64(aSign, aExp, zSig, status);

}